

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack4.h
# Opt level: O2

void ncnn::convolution_winograd_dot_pack4_sse
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint _w;
  int *piVar5;
  size_t sVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint _h;
  int iVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  int iVar23;
  float *pfVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  void *pvVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  __m128 _sum0;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  __m128 _sum1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m128 _sum2;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128 _sum3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128 _sum4;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128 _sum5;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128 _sum6;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128 _sum7;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 local_98 [64];
  size_t local_58;
  Mat *local_48;
  ulong local_40;
  void *local_38;
  
  _w = bottom_blob_tm->w;
  lVar32 = (long)(int)_w;
  uVar17 = bottom_blob_tm->h;
  iVar20 = bottom_blob_tm->c;
  local_58 = 0;
  local_98._0_8_ = (Allocator *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_98._24_4_ = 0;
  local_98._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if (lVar32 < 0xc) {
    if ((int)_w < 8) {
      if ((int)_w < 4) {
        _h = _w;
        iVar26 = iVar20;
        if (1 < (int)_w) {
          iVar26 = iVar20 * 2;
          _h = (_w & 1) + 1;
        }
      }
      else {
        _h = (_w & 1) + 1 + (uint)((_w >> 1 & 1) != 0);
        iVar26 = iVar20 * 4;
      }
    }
    else {
      _h = (_w & 1) + 1 + (_w >> 2 & 1) + (uint)((_w >> 1 & 1) != 0);
      iVar26 = iVar20 * 8;
    }
  }
  else {
    uVar25 = (ulong)_w % 0xc;
    _h = ((uint)uVar25 & 1) + (int)(uVar25 >> 3) + _w / 0xc + ((uint)(uVar25 >> 2) & 1) +
         (uint)(((uint)uVar25 >> 1 & 1) != 0);
    iVar26 = iVar20 * 0xc;
  }
  local_98._32_8_ = local_98._0_8_;
  local_98._40_4_ = local_98._8_4_;
  local_98._44_4_ = local_98._12_4_;
  local_48 = kernel_tm;
  Mat::create((Mat *)local_98,iVar26,_h,uVar17,0x10,4,opt->workspace_allocator);
  uVar25 = 0;
  iVar26 = 0;
  if (0 < iVar20) {
    iVar26 = iVar20;
  }
  uVar11 = 0;
  if (0 < (int)uVar17) {
    uVar11 = (ulong)uVar17;
  }
  for (; uVar25 != uVar11; uVar25 = uVar25 + 1) {
    lVar29 = local_58 * uVar25 * local_98._16_8_;
    lVar27 = (long)(int)local_98._44_4_ * local_98._16_8_;
    lVar30 = uVar25 * lVar32;
    for (uVar18 = 0; (long)uVar18 < lVar32 + -0xb; uVar18 = uVar18 + 0xc) {
      pauVar12 = (undefined1 (*) [16])
                 ((long)(_func_int ***)local_98._0_8_ + (uVar18 / 0xc) * lVar27 + lVar29);
      pauVar21 = (undefined1 (*) [16])((uVar18 + lVar30) * 0x10 + (long)bottom_blob_tm->data);
      iVar23 = iVar26;
      while (bVar33 = iVar23 != 0, iVar23 = iVar23 + -1, bVar33) {
        auVar39 = vunpcklps_avx(*pauVar21,pauVar21[1]);
        auVar44 = vunpcklps_avx(pauVar21[2],pauVar21[3]);
        auVar35 = vunpckhps_avx(*pauVar21,pauVar21[1]);
        auVar40 = vunpckhps_avx(pauVar21[2],pauVar21[3]);
        auVar34 = vmovlhps_avx(auVar39,auVar44);
        auVar50 = vunpckhpd_avx(auVar39,auVar44);
        auVar39 = vmovlhps_avx(auVar35,auVar40);
        auVar52 = vunpckhpd_avx(auVar35,auVar40);
        auVar40 = vunpcklps_avx(pauVar21[4],pauVar21[5]);
        auVar54 = vunpcklps_avx(pauVar21[6],pauVar21[7]);
        auVar44 = vunpckhps_avx(pauVar21[4],pauVar21[5]);
        auVar47 = vunpckhps_avx(pauVar21[6],pauVar21[7]);
        auVar35 = vmovlhps_avx(auVar40,auVar54);
        auVar54 = vunpckhpd_avx(auVar40,auVar54);
        auVar40 = vmovlhps_avx(auVar44,auVar47);
        auVar56 = vunpckhpd_avx(auVar44,auVar47);
        auVar47 = vunpcklps_avx(pauVar21[8],pauVar21[9]);
        auVar58 = vunpcklps_avx(pauVar21[10],pauVar21[0xb]);
        auVar59 = vunpckhps_avx(pauVar21[8],pauVar21[9]);
        auVar60 = vunpckhps_avx(pauVar21[10],pauVar21[0xb]);
        auVar44 = vmovlhps_avx(auVar47,auVar58);
        auVar58 = vunpckhpd_avx(auVar47,auVar58);
        auVar47 = vmovlhps_avx(auVar59,auVar60);
        auVar59 = vunpckhpd_avx(auVar59,auVar60);
        *pauVar12 = auVar34;
        pauVar12[1] = auVar35;
        pauVar12[2] = auVar44;
        pauVar12[3] = auVar50;
        pauVar12[4] = auVar54;
        pauVar12[5] = auVar58;
        pauVar12[6] = auVar39;
        pauVar12[7] = auVar40;
        pauVar12[8] = auVar47;
        pauVar12[9] = auVar52;
        pauVar12[10] = auVar56;
        pauVar12[0xb] = auVar59;
        pauVar21 = pauVar21 + bottom_blob_tm->cstep;
        pauVar12 = pauVar12 + 0xc;
      }
    }
    for (; (long)uVar18 < lVar32 + -7; uVar18 = uVar18 + 8) {
      pauVar21 = (undefined1 (*) [16])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)(uint)((int)((uVar18 & 0xffffffff) % 0xc >> 3) +
                              (int)((uVar18 & 0xffffffff) / 0xc)) * lVar27 + lVar29);
      pauVar12 = (undefined1 (*) [16])((uVar18 + lVar30) * 0x10 + (long)bottom_blob_tm->data);
      iVar23 = iVar26;
      while (bVar33 = iVar23 != 0, iVar23 = iVar23 + -1, bVar33) {
        auVar39 = vunpcklps_avx(*pauVar12,pauVar12[1]);
        auVar44 = vunpcklps_avx(pauVar12[2],pauVar12[3]);
        auVar35 = vunpckhps_avx(*pauVar12,pauVar12[1]);
        auVar40 = vunpckhps_avx(pauVar12[2],pauVar12[3]);
        auVar34 = vmovlhps_avx(auVar39,auVar44);
        auVar44 = vunpckhpd_avx(auVar39,auVar44);
        auVar39 = vmovlhps_avx(auVar35,auVar40);
        auVar47 = vunpckhpd_avx(auVar35,auVar40);
        auVar40 = vunpcklps_avx(pauVar12[4],pauVar12[5]);
        auVar50 = vunpcklps_avx(pauVar12[6],pauVar12[7]);
        auVar52 = vunpckhps_avx(pauVar12[4],pauVar12[5]);
        auVar54 = vunpckhps_avx(pauVar12[6],pauVar12[7]);
        auVar35 = vmovlhps_avx(auVar40,auVar50);
        auVar50 = vunpckhpd_avx(auVar40,auVar50);
        auVar40 = vmovlhps_avx(auVar52,auVar54);
        auVar52 = vunpckhpd_avx(auVar52,auVar54);
        *pauVar21 = auVar34;
        pauVar21[1] = auVar35;
        pauVar21[2] = auVar44;
        pauVar21[3] = auVar50;
        pauVar21[4] = auVar39;
        pauVar21[5] = auVar40;
        pauVar21[6] = auVar47;
        pauVar21[7] = auVar52;
        pauVar12 = pauVar12 + bottom_blob_tm->cstep;
        pauVar21 = pauVar21 + 8;
      }
    }
    for (; (long)(uVar18 | 3) < lVar32; uVar18 = uVar18 + 4) {
      uVar13 = (uVar18 & 0xffffffff) % 0xc;
      pauVar21 = (undefined1 (*) [16])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)((int)(uVar13 >> 3) + (int)((uVar18 & 0xffffffff) / 0xc) +
                        (uint)(((uint)uVar13 >> 2 & 1) != 0)) * lVar27 + lVar29);
      pauVar12 = (undefined1 (*) [16])((uVar18 + lVar30) * 0x10 + (long)bottom_blob_tm->data);
      iVar23 = iVar26;
      while (bVar33 = iVar23 != 0, iVar23 = iVar23 + -1, bVar33) {
        auVar39 = vunpcklps_avx(*pauVar12,pauVar12[1]);
        auVar35 = vunpcklps_avx(pauVar12[2],pauVar12[3]);
        auVar40 = vunpckhps_avx(*pauVar12,pauVar12[1]);
        auVar44 = vunpckhps_avx(pauVar12[2],pauVar12[3]);
        auVar34 = vmovlhps_avx(auVar39,auVar35);
        auVar35 = vunpckhpd_avx(auVar39,auVar35);
        auVar39 = vmovlhps_avx(auVar40,auVar44);
        auVar40 = vunpckhpd_avx(auVar40,auVar44);
        *pauVar21 = auVar34;
        pauVar21[1] = auVar35;
        pauVar21[2] = auVar39;
        pauVar21[3] = auVar40;
        pauVar12 = pauVar12 + bottom_blob_tm->cstep;
        pauVar21 = pauVar21 + 4;
      }
    }
    for (; (long)(uVar18 | 1) < lVar32; uVar18 = uVar18 + 2) {
      uVar13 = (uVar18 & 0xffffffff) % 0xc;
      pauVar12 = (undefined1 (*) [16])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)(((uint)(uVar13 >> 2) & 1) +
                         (int)(uVar13 >> 3) + (int)((uVar18 & 0xffffffff) / 0xc) +
                        (uint)(((uint)uVar13 >> 1 & 1) != 0)) * lVar27 + lVar29);
      pauVar21 = (undefined1 (*) [16])((uVar18 + lVar30) * 0x10 + (long)bottom_blob_tm->data);
      iVar23 = iVar26;
      while (bVar33 = iVar23 != 0, iVar23 = iVar23 + -1, bVar33) {
        auVar39 = vunpcklps_avx(*pauVar21,pauVar21[1]);
        auVar34 = vunpckhps_avx(*pauVar21,pauVar21[1]);
        *pauVar12 = auVar39;
        pauVar12[1] = auVar34;
        pauVar21 = pauVar21 + bottom_blob_tm->cstep;
        pauVar12 = pauVar12 + 2;
      }
    }
    for (; (long)uVar18 < lVar32; uVar18 = uVar18 + 1) {
      uVar13 = (uVar18 & 0xffffffff) % 0xc;
      pauVar21 = (undefined1 (*) [16])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)(((uint)uVar13 & 1) + (int)(uVar13 >> 3) +
                         (int)((uVar18 & 0xffffffff) / 0xc) + ((uint)(uVar13 >> 2) & 1) +
                        (uint)(((uint)uVar13 >> 1 & 1) != 0)) * lVar27 + lVar29);
      pauVar12 = (undefined1 (*) [16])((uVar18 + lVar30) * 0x10 + (long)bottom_blob_tm->data);
      iVar23 = iVar26;
      while (bVar33 = iVar23 != 0, iVar23 = iVar23 + -1, bVar33) {
        *pauVar21 = *pauVar12;
        pauVar12 = pauVar12 + bottom_blob_tm->cstep;
        pauVar21 = pauVar21 + 1;
      }
    }
  }
  piVar5 = bottom_blob_tm->refcount;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (bottom_blob_tm->allocator == (Allocator *)0x0) {
        free(bottom_blob_tm->data);
      }
      else {
        (*bottom_blob_tm->allocator->_vptr_Allocator[3])();
      }
    }
  }
  bottom_blob_tm->cstep = 0;
  auVar34 = ZEXT816(0) << 0x40;
  bottom_blob_tm->data = (void *)auVar34._0_8_;
  bottom_blob_tm->refcount = (int *)auVar34._8_8_;
  *(undefined1 (*) [16])((long)&bottom_blob_tm->refcount + 4) = auVar34;
  bottom_blob_tm->allocator = (Allocator *)auVar34._0_8_;
  bottom_blob_tm->dims = auVar34._8_4_;
  bottom_blob_tm->w = auVar34._12_4_;
  bottom_blob_tm->w = auVar34._0_4_;
  bottom_blob_tm->h = auVar34._4_4_;
  bottom_blob_tm->d = auVar34._8_4_;
  bottom_blob_tm->c = auVar34._12_4_;
  Mat::create(top_blob_tm,_w,uVar17,outch,0x10,4,opt->workspace_allocator);
  uVar25 = 0;
  uVar18 = (ulong)(uint)(iVar20 << 2);
  if (iVar20 << 2 < 1) {
    uVar18 = uVar25;
  }
  uVar13 = (ulong)(uint)outch;
  if (outch < 1) {
    uVar13 = uVar25;
  }
  while (uVar22 = uVar25, uVar22 != uVar13) {
    pauVar12 = (undefined1 (*) [16])
               (top_blob_tm->cstep * uVar22 * top_blob_tm->elemsize + (long)top_blob_tm->data);
    sVar6 = local_48->elemsize;
    local_38 = (void *)(local_48->cstep * uVar22 * sVar6 + (long)local_48->data);
    lVar27 = (long)local_48->w * sVar6;
    pvVar28 = (void *)(local_48->cstep * sVar6 * uVar22 + (long)local_48->data);
    for (uVar25 = 0; uVar25 != uVar11; uVar25 = uVar25 + 1) {
      lVar30 = (long)(int)local_98._44_4_;
      lVar29 = local_58 * uVar25;
      for (uVar19 = 0; (long)uVar19 < lVar32 + -0xb; uVar19 = uVar19 + 0xc) {
        pfVar14 = (float *)((long)(_func_int ***)local_98._0_8_ +
                           (uVar19 / 0xc) * local_98._16_8_ * lVar30 + lVar29 * local_98._16_8_);
        uVar16 = uVar18;
        pfVar24 = (float *)(lVar27 * uVar25 + (long)local_38);
        auVar34 = ZEXT816(0) << 0x40;
        auVar39 = ZEXT816(0) << 0x40;
        auVar35 = ZEXT816(0) << 0x40;
        auVar40 = ZEXT816(0) << 0x40;
        auVar44 = ZEXT816(0) << 0x40;
        auVar47 = ZEXT816(0) << 0x40;
        auVar50 = ZEXT816(0) << 0x40;
        auVar52 = ZEXT816(0) << 0x40;
        auVar54 = ZEXT816(0) << 0x40;
        auVar56 = ZEXT816(0) << 0x40;
        auVar58 = ZEXT816(0) << 0x40;
        auVar59 = ZEXT816(0) << 0x40;
        while (iVar20 = (int)uVar16, uVar16 = (ulong)(iVar20 - 1), iVar20 != 0) {
          fVar4 = *pfVar24;
          fVar2 = pfVar24[1];
          fVar3 = pfVar24[2];
          fVar7 = pfVar24[3];
          fVar1 = *pfVar14;
          auVar61._0_4_ = fVar1 * fVar4 + auVar59._0_4_;
          auVar61._4_4_ = fVar1 * fVar2 + auVar59._4_4_;
          auVar61._8_4_ = fVar1 * fVar3 + auVar59._8_4_;
          auVar61._12_4_ = fVar1 * fVar7 + auVar59._12_4_;
          fVar1 = pfVar14[1];
          auVar60._0_4_ = fVar1 * fVar4 + auVar58._0_4_;
          auVar60._4_4_ = fVar1 * fVar2 + auVar58._4_4_;
          auVar60._8_4_ = fVar1 * fVar3 + auVar58._8_4_;
          auVar60._12_4_ = fVar1 * fVar7 + auVar58._12_4_;
          fVar1 = pfVar14[2];
          auVar59._0_4_ = fVar1 * fVar4 + auVar56._0_4_;
          auVar59._4_4_ = fVar1 * fVar2 + auVar56._4_4_;
          auVar59._8_4_ = fVar1 * fVar3 + auVar56._8_4_;
          auVar59._12_4_ = fVar1 * fVar7 + auVar56._12_4_;
          fVar1 = pfVar14[3];
          auVar58._0_4_ = fVar1 * fVar4 + auVar54._0_4_;
          auVar58._4_4_ = fVar1 * fVar2 + auVar54._4_4_;
          auVar58._8_4_ = fVar1 * fVar3 + auVar54._8_4_;
          auVar58._12_4_ = fVar1 * fVar7 + auVar54._12_4_;
          fVar1 = pfVar14[4];
          auVar56._0_4_ = fVar1 * fVar4 + auVar52._0_4_;
          auVar56._4_4_ = fVar1 * fVar2 + auVar52._4_4_;
          auVar56._8_4_ = fVar1 * fVar3 + auVar52._8_4_;
          auVar56._12_4_ = fVar1 * fVar7 + auVar52._12_4_;
          fVar1 = pfVar14[5];
          auVar54._0_4_ = fVar1 * fVar4 + auVar50._0_4_;
          auVar54._4_4_ = fVar1 * fVar2 + auVar50._4_4_;
          auVar54._8_4_ = fVar1 * fVar3 + auVar50._8_4_;
          auVar54._12_4_ = fVar1 * fVar7 + auVar50._12_4_;
          fVar1 = pfVar14[6];
          auVar52._0_4_ = fVar1 * fVar4 + auVar47._0_4_;
          auVar52._4_4_ = fVar1 * fVar2 + auVar47._4_4_;
          auVar52._8_4_ = fVar1 * fVar3 + auVar47._8_4_;
          auVar52._12_4_ = fVar1 * fVar7 + auVar47._12_4_;
          fVar1 = pfVar14[7];
          auVar50._0_4_ = fVar1 * fVar4 + auVar44._0_4_;
          auVar50._4_4_ = fVar1 * fVar2 + auVar44._4_4_;
          auVar50._8_4_ = fVar1 * fVar3 + auVar44._8_4_;
          auVar50._12_4_ = fVar1 * fVar7 + auVar44._12_4_;
          fVar1 = pfVar14[8];
          auVar47._0_4_ = fVar1 * fVar4 + auVar40._0_4_;
          auVar47._4_4_ = fVar1 * fVar2 + auVar40._4_4_;
          auVar47._8_4_ = fVar1 * fVar3 + auVar40._8_4_;
          auVar47._12_4_ = fVar1 * fVar7 + auVar40._12_4_;
          fVar1 = pfVar14[9];
          auVar44._0_4_ = fVar1 * fVar4 + auVar35._0_4_;
          auVar44._4_4_ = fVar1 * fVar2 + auVar35._4_4_;
          auVar44._8_4_ = fVar1 * fVar3 + auVar35._8_4_;
          auVar44._12_4_ = fVar1 * fVar7 + auVar35._12_4_;
          fVar1 = pfVar14[10];
          auVar35._0_4_ = fVar1 * fVar4 + auVar34._0_4_;
          auVar35._4_4_ = fVar1 * fVar2 + auVar34._4_4_;
          auVar35._8_4_ = fVar1 * fVar3 + auVar34._8_4_;
          auVar35._12_4_ = fVar1 * fVar7 + auVar34._12_4_;
          fVar1 = pfVar14[0xb];
          auVar40._0_4_ = fVar1 * fVar4 + auVar39._0_4_;
          auVar40._4_4_ = fVar1 * fVar2 + auVar39._4_4_;
          auVar40._8_4_ = fVar1 * fVar3 + auVar39._8_4_;
          auVar40._12_4_ = fVar1 * fVar7 + auVar39._12_4_;
          pfVar14 = pfVar14 + 0xc;
          pfVar24 = pfVar24 + 4;
          auVar34 = auVar35;
          auVar39 = auVar40;
          auVar35 = auVar44;
          auVar40 = auVar47;
          auVar44 = auVar50;
          auVar47 = auVar52;
          auVar50 = auVar54;
          auVar52 = auVar56;
          auVar54 = auVar58;
          auVar56 = auVar59;
          auVar58 = auVar60;
          auVar59 = auVar61;
        }
        *pauVar12 = auVar59;
        pauVar12[1] = auVar58;
        pauVar12[2] = auVar56;
        pauVar12[3] = auVar54;
        pauVar12[4] = auVar52;
        pauVar12[5] = auVar50;
        pauVar12[6] = auVar47;
        pauVar12[7] = auVar44;
        pauVar12[8] = auVar40;
        pauVar12[9] = auVar35;
        pauVar12[10] = auVar34;
        pauVar12[0xb] = auVar39;
        pauVar12 = pauVar12 + 0xc;
      }
      while( true ) {
        if ((int)_w <= (int)uVar19 + 7) break;
        lVar15 = ((ulong)(uint)((int)((uVar19 & 0xffffffff) / 0xc) +
                               (int)((uVar19 & 0xffffffff) % 0xc >> 3)) * lVar30 + lVar29) *
                 local_98._16_8_;
        lVar31 = 0;
        uVar16 = uVar18;
        auVar34 = ZEXT816(0) << 0x40;
        auVar39 = ZEXT816(0) << 0x40;
        auVar35 = ZEXT816(0) << 0x40;
        auVar40 = ZEXT816(0) << 0x40;
        auVar44 = ZEXT816(0) << 0x40;
        auVar47 = ZEXT816(0) << 0x40;
        auVar50 = ZEXT816(0) << 0x40;
        auVar52 = ZEXT816(0) << 0x40;
        while (iVar20 = (int)uVar16, uVar16 = (ulong)(iVar20 - 1), iVar20 != 0) {
          pfVar24 = (float *)((long)pvVar28 + lVar31);
          fVar4 = *pfVar24;
          fVar2 = pfVar24[1];
          fVar3 = pfVar24[2];
          fVar7 = pfVar24[3];
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar31 * 2 + lVar15);
          auVar36._0_4_ = fVar1 * fVar4 + auVar34._0_4_;
          auVar36._4_4_ = fVar1 * fVar2 + auVar34._4_4_;
          auVar36._8_4_ = fVar1 * fVar3 + auVar34._8_4_;
          auVar36._12_4_ = fVar1 * fVar7 + auVar34._12_4_;
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar31 * 2 + lVar15 + 4);
          auVar41._0_4_ = fVar1 * fVar4 + auVar39._0_4_;
          auVar41._4_4_ = fVar1 * fVar2 + auVar39._4_4_;
          auVar41._8_4_ = fVar1 * fVar3 + auVar39._8_4_;
          auVar41._12_4_ = fVar1 * fVar7 + auVar39._12_4_;
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar31 * 2 + lVar15);
          auVar45._0_4_ = fVar1 * fVar4 + auVar35._0_4_;
          auVar45._4_4_ = fVar1 * fVar2 + auVar35._4_4_;
          auVar45._8_4_ = fVar1 * fVar3 + auVar35._8_4_;
          auVar45._12_4_ = fVar1 * fVar7 + auVar35._12_4_;
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar31 * 2 + lVar15 + 4);
          auVar48._0_4_ = fVar1 * fVar4 + auVar40._0_4_;
          auVar48._4_4_ = fVar1 * fVar2 + auVar40._4_4_;
          auVar48._8_4_ = fVar1 * fVar3 + auVar40._8_4_;
          auVar48._12_4_ = fVar1 * fVar7 + auVar40._12_4_;
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x10))->_vptr_Allocator +
                            lVar31 * 2 + lVar15);
          auVar51._0_4_ = fVar1 * fVar4 + auVar44._0_4_;
          auVar51._4_4_ = fVar1 * fVar2 + auVar44._4_4_;
          auVar51._8_4_ = fVar1 * fVar3 + auVar44._8_4_;
          auVar51._12_4_ = fVar1 * fVar7 + auVar44._12_4_;
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x10))->_vptr_Allocator +
                            lVar31 * 2 + lVar15 + 4);
          auVar53._0_4_ = fVar1 * fVar4 + auVar47._0_4_;
          auVar53._4_4_ = fVar1 * fVar2 + auVar47._4_4_;
          auVar53._8_4_ = fVar1 * fVar3 + auVar47._8_4_;
          auVar53._12_4_ = fVar1 * fVar7 + auVar47._12_4_;
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x18))->_vptr_Allocator +
                            lVar31 * 2 + lVar15);
          auVar55._0_4_ = fVar1 * fVar4 + auVar50._0_4_;
          auVar55._4_4_ = fVar1 * fVar2 + auVar50._4_4_;
          auVar55._8_4_ = fVar1 * fVar3 + auVar50._8_4_;
          auVar55._12_4_ = fVar1 * fVar7 + auVar50._12_4_;
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x18))->_vptr_Allocator +
                            lVar31 * 2 + lVar15 + 4);
          auVar57._0_4_ = fVar1 * fVar4 + auVar52._0_4_;
          auVar57._4_4_ = fVar1 * fVar2 + auVar52._4_4_;
          auVar57._8_4_ = fVar1 * fVar3 + auVar52._8_4_;
          auVar57._12_4_ = fVar1 * fVar7 + auVar52._12_4_;
          lVar31 = lVar31 + 0x10;
          auVar34 = auVar36;
          auVar39 = auVar41;
          auVar35 = auVar45;
          auVar40 = auVar48;
          auVar44 = auVar51;
          auVar47 = auVar53;
          auVar50 = auVar55;
          auVar52 = auVar57;
        }
        *pauVar12 = auVar34;
        pauVar12[1] = auVar39;
        pauVar12[2] = auVar35;
        pauVar12[3] = auVar40;
        pauVar12[4] = auVar44;
        pauVar12[5] = auVar47;
        pauVar12[6] = auVar50;
        pauVar12[7] = auVar52;
        pauVar12 = pauVar12 + 8;
        uVar19 = (ulong)((int)uVar19 + 8);
      }
      while( true ) {
        uVar16 = (uVar19 & 0xffffffff) % 0xc;
        if ((int)_w <= (int)((uint)uVar19 | 3)) break;
        lVar31 = ((ulong)((int)(uVar16 >> 3) + (int)((uVar19 & 0xffffffff) / 0xc) +
                         (uint)(((uint)uVar16 >> 2 & 1) != 0)) * lVar30 + lVar29) * local_98._16_8_;
        lVar15 = 0;
        uVar16 = uVar18;
        auVar34 = ZEXT816(0) << 0x40;
        auVar39 = ZEXT816(0) << 0x40;
        auVar35 = ZEXT816(0) << 0x40;
        auVar40 = ZEXT816(0) << 0x40;
        while (iVar20 = (int)uVar16, uVar16 = (ulong)(iVar20 - 1), iVar20 != 0) {
          pfVar24 = (float *)((long)pvVar28 + lVar15);
          fVar7 = *pfVar24;
          fVar8 = pfVar24[1];
          fVar9 = pfVar24[2];
          fVar10 = pfVar24[3];
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar15 + lVar31);
          fVar4 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar15 + lVar31 + 4);
          fVar2 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar15 + lVar31);
          fVar3 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar15 + lVar31 + 4);
          auVar37._0_4_ = fVar1 * fVar7 + auVar34._0_4_;
          auVar37._4_4_ = fVar1 * fVar8 + auVar34._4_4_;
          auVar37._8_4_ = fVar1 * fVar9 + auVar34._8_4_;
          auVar37._12_4_ = fVar1 * fVar10 + auVar34._12_4_;
          auVar42._0_4_ = fVar4 * fVar7 + auVar39._0_4_;
          auVar42._4_4_ = fVar4 * fVar8 + auVar39._4_4_;
          auVar42._8_4_ = fVar4 * fVar9 + auVar39._8_4_;
          auVar42._12_4_ = fVar4 * fVar10 + auVar39._12_4_;
          auVar46._0_4_ = fVar2 * fVar7 + auVar35._0_4_;
          auVar46._4_4_ = fVar2 * fVar8 + auVar35._4_4_;
          auVar46._8_4_ = fVar2 * fVar9 + auVar35._8_4_;
          auVar46._12_4_ = fVar2 * fVar10 + auVar35._12_4_;
          auVar49._0_4_ = fVar3 * fVar7 + auVar40._0_4_;
          auVar49._4_4_ = fVar3 * fVar8 + auVar40._4_4_;
          auVar49._8_4_ = fVar3 * fVar9 + auVar40._8_4_;
          auVar49._12_4_ = fVar3 * fVar10 + auVar40._12_4_;
          lVar15 = lVar15 + 0x10;
          auVar34 = auVar37;
          auVar39 = auVar42;
          auVar35 = auVar46;
          auVar40 = auVar49;
        }
        *pauVar12 = auVar34;
        pauVar12[1] = auVar39;
        pauVar12[2] = auVar35;
        pauVar12[3] = auVar40;
        pauVar12 = pauVar12 + 4;
        uVar19 = (ulong)((uint)uVar19 + 4);
      }
      while( true ) {
        uVar16 = (uVar19 & 0xffffffff) % 0xc;
        if ((int)_w <= (int)((uint)uVar19 | 1)) break;
        lVar15 = ((ulong)(((uint)(uVar16 >> 2) & 1) +
                          (int)(uVar16 >> 3) + (int)((uVar19 & 0xffffffff) / 0xc) +
                         (uint)(((uint)uVar16 >> 1 & 1) != 0)) * lVar30 + lVar29) * local_98._16_8_;
        lVar31 = 0;
        uVar16 = uVar18;
        auVar34 = ZEXT816(0) << 0x40;
        auVar39 = ZEXT816(0) << 0x40;
        while (iVar20 = (int)uVar16, uVar16 = (ulong)(iVar20 - 1), iVar20 != 0) {
          pfVar24 = (float *)((long)pvVar28 + lVar31 * 2);
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar31 + lVar15);
          fVar4 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar31 + lVar15 + 4);
          auVar38._0_4_ = fVar1 * *pfVar24 + auVar34._0_4_;
          auVar38._4_4_ = fVar1 * pfVar24[1] + auVar34._4_4_;
          auVar38._8_4_ = fVar1 * pfVar24[2] + auVar34._8_4_;
          auVar38._12_4_ = fVar1 * pfVar24[3] + auVar34._12_4_;
          auVar43._0_4_ = fVar4 * *pfVar24 + auVar39._0_4_;
          auVar43._4_4_ = fVar4 * pfVar24[1] + auVar39._4_4_;
          auVar43._8_4_ = fVar4 * pfVar24[2] + auVar39._8_4_;
          auVar43._12_4_ = fVar4 * pfVar24[3] + auVar39._12_4_;
          lVar31 = lVar31 + 8;
          auVar34 = auVar38;
          auVar39 = auVar43;
        }
        *pauVar12 = auVar34;
        pauVar12[1] = auVar39;
        pauVar12 = pauVar12 + 2;
        uVar19 = (ulong)((uint)uVar19 + 2);
      }
      while( true ) {
        uVar17 = (uint)uVar19;
        uVar16 = (uVar19 & 0xffffffff) % 0xc;
        if ((int)_w <= (int)uVar17) break;
        lVar15 = 0;
        iVar20 = (int)uVar18;
        auVar34 = ZEXT816(0) << 0x40;
        while (bVar33 = iVar20 != 0, iVar20 = iVar20 + -1, bVar33) {
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ +
                            lVar15 + ((ulong)(((uint)(uVar16 >> 2) & 1) +
                                              (uVar17 & 1) + (int)(uVar16 >> 3) +
                                              (int)((uVar19 & 0xffffffff) / 0xc) +
                                             (uint)(((uint)uVar16 >> 1 & 1) != 0)) * lVar30 + lVar29
                                     ) * local_98._16_8_);
          pfVar24 = (float *)((long)pvVar28 + lVar15 * 4);
          auVar39._0_4_ = fVar1 * *pfVar24 + auVar34._0_4_;
          auVar39._4_4_ = fVar1 * pfVar24[1] + auVar34._4_4_;
          auVar39._8_4_ = fVar1 * pfVar24[2] + auVar34._8_4_;
          auVar39._12_4_ = fVar1 * pfVar24[3] + auVar34._12_4_;
          lVar15 = lVar15 + 4;
          auVar34 = auVar39;
        }
        *pauVar12 = auVar34;
        pauVar12 = pauVar12 + 1;
        uVar19 = (ulong)(uVar17 + 1);
      }
      pvVar28 = (void *)((long)pvVar28 + lVar27);
    }
    local_40 = uVar22;
    uVar25 = uVar22 + 1;
  }
  piVar5 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        free((void *)local_98._0_8_);
      }
      else {
        (*(*(_func_int ***)local_98._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack4_sse(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 16u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;
        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x12
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(r0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(r0 + 4 * 9);
                __m128 _ra = _mm_load_ps(r0 + 4 * 10);
                __m128 _rb = _mm_load_ps(r0 + 4 * 11);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r8);
                _mm_store_ps(tmpptr + 4 * 3, _r1);
                _mm_store_ps(tmpptr + 4 * 4, _r5);
                _mm_store_ps(tmpptr + 4 * 5, _r9);
                _mm_store_ps(tmpptr + 4 * 6, _r2);
                _mm_store_ps(tmpptr + 4 * 7, _r6);
                _mm_store_ps(tmpptr + 4 * 8, _ra);
                _mm_store_ps(tmpptr + 4 * 9, _r3);
                _mm_store_ps(tmpptr + 4 * 10, _r7);
                _mm_store_ps(tmpptr + 4 * 11, _rb);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 48;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x8
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r1);
                _mm_store_ps(tmpptr + 4 * 3, _r5);
                _mm_store_ps(tmpptr + 4 * 4, _r2);
                _mm_store_ps(tmpptr + 4 * 5, _r6);
                _mm_store_ps(tmpptr + 4 * 6, _r3);
                _mm_store_ps(tmpptr + 4 * 7, _r7);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 32;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x4
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r1);
                _mm_store_ps(tmpptr + 4 * 2, _r2);
                _mm_store_ps(tmpptr + 4 * 3, _r3);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 16;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x2
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);

                __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                _mm_store_ps(tmpptr, _r01_0);
                _mm_store_ps(tmpptr + 4, _r01_1);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 8;
            }
        }
        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                __m128 _val = _mm_load_ps(r0);
                _mm_store_ps(tmpptr, _val);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 4;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();
                __m128 _sum8 = _mm_setzero_ps();
                __m128 _sum9 = _mm_setzero_ps();
                __m128 _suma = _mm_setzero_ps();
                __m128 _sumb = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);
                    __m128 _val8 = _mm_load1_ps(r0 + 8);
                    __m128 _val9 = _mm_load1_ps(r0 + 9);
                    __m128 _vala = _mm_load1_ps(r0 + 10);
                    __m128 _valb = _mm_load1_ps(r0 + 11);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                    _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                    _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);
                _mm_store_ps(output0_tm + 4 * 8, _sum8);
                _mm_store_ps(output0_tm + 4 * 9, _sum9);
                _mm_store_ps(output0_tm + 4 * 10, _suma);
                _mm_store_ps(output0_tm + 4 * 11, _sumb);

                output0_tm += 4 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);

                output0_tm += 4 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);

                output0_tm += 4 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);

                output0_tm += 4 * 2;
            }
            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);
                    __m128 _val0 = _mm_load1_ps(r0);
                    _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                    r0 += 1;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum);

                output0_tm += 4;
            }
        }
    }
}